

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O0

int ON_String::FormatVargsIntoBuffer
              (char *buffer,size_t buffer_capacity,char *format,__va_list_tag *args)

{
  int local_5c;
  int local_4c;
  undefined8 uStack_48;
  int len;
  va_list args_copy;
  __va_list_tag *args_local;
  char *format_local;
  size_t buffer_capacity_local;
  char *buffer_local;
  
  if ((buffer == (char *)0x0) || (buffer_capacity == 0)) {
    buffer_local._4_4_ = -1;
  }
  else {
    *buffer = '\0';
    args_copy[0].overflow_arg_area = args->reg_save_area;
    uStack_48._0_4_ = args->gp_offset;
    uStack_48._4_4_ = args->fp_offset;
    args_copy[0]._0_8_ = args->overflow_arg_area;
    args_copy[0].reg_save_area = args;
    local_4c = vsnprintf(buffer,buffer_capacity,format,&uStack_48);
    if (buffer_capacity <= (ulong)(long)local_4c) {
      local_4c = -1;
    }
    if (local_4c < 1) {
      local_5c = 0;
    }
    else {
      local_5c = local_4c;
    }
    buffer[local_5c] = '\0';
    buffer[buffer_capacity - 1] = '\0';
    buffer_local._4_4_ = local_4c;
  }
  return buffer_local._4_4_;
}

Assistant:

int ON_String::FormatVargsIntoBuffer(
  char* buffer,
  size_t buffer_capacity,
  const char* format,
  va_list args
  )
{
  if (0 == buffer || buffer_capacity <= 0)
    return -1;
  buffer[0] = 0;
#if defined(ON_COMPILER_CLANG) || defined(ON_COMPILER_GNU)
  // CLang modifies args so a copy is required
  va_list args_copy;
  va_copy (args_copy, args);
#if defined(ON_RUNTIME_ANDROID) || defined(ON_RUNTIME_LINUX) || defined(ON_RUNTIME_WASM)
  int len = vsnprintf(buffer, buffer_capacity, format, args_copy);
#else
  int len = vsnprintf_l(buffer, buffer_capacity, ON_Locale::Ordinal.NumericLocalePtr(), format, args_copy);
#endif
  va_end(args_copy);
#else
  int len = _vsprintf_p_l(buffer, buffer_capacity, format, ON_Locale::Ordinal.NumericLocalePtr(), args);
#endif
  if (((size_t)len) >= buffer_capacity)
    len = -1;
  buffer[(len <= 0) ? 0 : len] = 0;
  buffer[buffer_capacity - 1] = 0;
  return len;
}